

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

TaskDatabase * AI::setupTasks(void)

{
  TaskDatabase *in_RDI;
  Task TStack_1858;
  Task local_14e0;
  Task local_1168;
  Task local_df0;
  Task local_a78;
  Task local_700;
  Task local_388;
  
  TaskDatabase::TaskDatabase(in_RDI);
  create_Browse();
  TaskDatabase::addTask(in_RDI,Browse,&local_388);
  Task::~Task(&local_388);
  create_Wander();
  TaskDatabase::addTask(in_RDI,Wander,&local_700);
  Task::~Task(&local_700);
  create_Chase(&local_a78,in_RDI);
  TaskDatabase::addTask(in_RDI,Chase,&local_a78);
  Task::~Task(&local_a78);
  create_Bother();
  TaskDatabase::addTask(in_RDI,Bother,&local_df0);
  Task::~Task(&local_df0);
  create_FaceSound();
  TaskDatabase::addTask(in_RDI,FaceSound,&local_1168);
  Task::~Task(&local_1168);
  create_InvestigateSound();
  TaskDatabase::addTask(in_RDI,InvestigateSound,&local_14e0);
  Task::~Task(&local_14e0);
  create_Null();
  TaskDatabase::addTask(in_RDI,Null,&TStack_1858);
  Task::~Task(&TStack_1858);
  setupPredicates(in_RDI);
  return in_RDI;
}

Assistant:

TaskDatabase setupTasks()
	{
		TaskDatabase tasks;
		
		tasks.addTask(TaskIdentifier::Browse, create_Browse());
		tasks.addTask(TaskIdentifier::Wander, create_Wander());
		tasks.addTask(TaskIdentifier::Chase, create_Chase(tasks));
		//tasks.addTask(TaskIdentifier::Search, create_Search());
		//tasks.addTask(TaskIdentifier::Stare, create_Stare());
		tasks.addTask(TaskIdentifier::Bother, create_Bother());
		tasks.addTask(TaskIdentifier::FaceSound, create_FaceSound());
		tasks.addTask(TaskIdentifier::InvestigateSound, create_InvestigateSound());
		/*tasks.addTask(TaskIdentifier::FollowPath, create_FollowPath());
		tasks.addTask(TaskIdentifier::FindSeat, create_FindSeat(tasks));
		tasks.addTask(TaskIdentifier::Relax, create_Relax());
		tasks.addTask(TaskIdentifier::React_Dismiss, create_React_Dismiss());
		tasks.addTask(TaskIdentifier::React_FoundPlayer, create_React_FoundPlayer());
		tasks.addTask(TaskIdentifier::React_LostPlayer, create_React_LostPlayer());
		tasks.addTask(TaskIdentifier::React_Sight, create_React_Sight());
		tasks.addTask(TaskIdentifier::React_Sound, create_React_Sound());
		tasks.addTask(TaskIdentifier::TrackHead, create_TrackHead());*/
		tasks.addTask(TaskIdentifier::Null, create_Null());

		//copyConsiderations(availableUTasks, tasks);
		
		setupPredicates(tasks);

		return tasks;

	}